

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuPrivate::drawTearOff(QMenuPrivate *this,QPainter *painter,QRect *rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  QWidget *widget;
  int iVar6;
  QStyle *pQVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  QStyleOptionMenuItem menuOpt;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  if (((painter != (QPainter *)0x0) &&
      (uVar1 = rect->x1, uVar3 = rect->y1, uVar2 = rect->x2, uVar4 = rect->y2,
      auVar8._0_4_ = -(uint)((int)uVar2 < (int)uVar1), auVar8._4_4_ = auVar8._0_4_,
      auVar8._8_4_ = -(uint)((int)uVar4 < (int)uVar3),
      auVar8._12_4_ = -(uint)((int)uVar4 < (int)uVar3), iVar6 = movmskpd((int)lVar5,auVar8),
      iVar6 == 0)) && ((this->field_0x421 & 2) != 0)) {
    widget = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    memset(&menuOpt,0xaa,0x98);
    QStyleOptionMenuItem::QStyleOptionMenuItem(&menuOpt);
    QStyleOption::initFrom(&menuOpt.super_QStyleOption,widget);
    menuOpt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x0;
    menuOpt.checkType = NotCheckable;
    menuOpt.maxIconWidth = 0;
    menuOpt.reservedShortcutWidth = 0;
    menuOpt.super_QStyleOption.rect.x1.m_i = (rect->x1).m_i;
    menuOpt.super_QStyleOption.rect.y1.m_i = (rect->y1).m_i;
    menuOpt.super_QStyleOption.rect.x2.m_i = (rect->x2).m_i;
    menuOpt.super_QStyleOption.rect.y2.m_i = (rect->y2).m_i;
    menuOpt.menuItemType = TearOff;
    if ((this->field_0x421 & 8) != 0) {
      menuOpt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
      super_QFlagsStorage<QStyle::StateFlag>.i =
           (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x8000;
    }
    QPainter::setClipRect((QRect *)painter,(int)&menuOpt + 0x10);
    pQVar7 = QWidget::style(widget);
    (**(code **)(*(long *)pQVar7 + 0xb8))(pQVar7,0x12,&menuOpt,painter,widget);
    QStyleOptionMenuItem::~QStyleOptionMenuItem(&menuOpt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::drawTearOff(QPainter *painter, const QRect &rect)
{
    if (!painter || rect.isEmpty())
        return;

    if (!tearoff)
        return;

    Q_Q(QMenu);
    QStyleOptionMenuItem menuOpt;
    menuOpt.initFrom(q);
    menuOpt.state = QStyle::State_None;
    menuOpt.checkType = QStyleOptionMenuItem::NotCheckable;
    menuOpt.maxIconWidth = 0;
    menuOpt.reservedShortcutWidth = 0;
    menuOpt.rect = rect;
    menuOpt.menuItemType = QStyleOptionMenuItem::TearOff;
    if (tearoffHighlighted)
        menuOpt.state |= QStyle::State_Selected;

    painter->setClipRect(menuOpt.rect);
    q->style()->drawControl(QStyle::CE_MenuTearoff, &menuOpt, painter, q);
}